

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O3

void __thiscall QFactoryLoader::~QFactoryLoader(QFactoryLoader *this)

{
  QList<QObject_*(*)()> *this_00;
  pointer puVar1;
  long *plVar2;
  Type *this_01;
  Type *pTVar3;
  ulong uVar4;
  iterator iVar5;
  iterator iVar6;
  QObject *pQVar7;
  _Head_base<0UL,_QLibraryPrivate_*,_false> this_02;
  ulong uVar8;
  long in_FS_OFFSET;
  QDeadlineTimer timeout;
  QFactoryLoader *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (-2 < (char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>::guard
                 ._q_value.super___atomic_base<signed_char>._M_i) {
    this_01 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
              ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                            *)this);
    timeout.t2 = 0;
    timeout.type = 1;
    timeout.t1 = 0x7fffffffffffffff;
    pTVar3 = this_01;
    QRecursiveMutex::tryLock(&this_01->mutex,timeout);
    pTVar3 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
             ::operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
                           *)pTVar3);
    local_28 = this;
    QtPrivate::sequential_erase_one<QList<QFactoryLoader*>,QFactoryLoader*>
              (&pTVar3->loaders,&local_28);
    QRecursiveMutex::unlock(&this_01->mutex);
  }
  uVar4 = (this->d).loadedLibraries.d.size;
  if (uVar4 != 0) {
    uVar8 = 0;
    do {
      if ((this->d).loadedLibraries.d.ptr[uVar8] == true) {
        puVar1 = (this->d).libraries.
                 super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(this->d).libraries.
                          super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <= uVar8)
        {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar8);
          }
          goto LAB_002d2ad4;
        }
        this_02._M_head_impl =
             *(QLibraryPrivate **)
              &puVar1[uVar8]._M_t.super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
               _M_t;
        if (((*(long *)((long)this_02._M_head_impl + 0x48) != 0) &&
            (*(int *)(*(long *)((long)this_02._M_head_impl + 0x48) + 4) != 0)) &&
           (plVar2 = *(long **)((long)this_02._M_head_impl + 0x50), plVar2 != (long *)0x0)) {
          (**(code **)(*plVar2 + 0x20))(plVar2);
          this_02._M_head_impl =
               *(QLibraryPrivate **)
                &puVar1[uVar8]._M_t.super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>
                 ._M_t;
        }
        QLibraryPrivate::unload(this_02._M_head_impl,UnloadSys);
        uVar4 = (this->d).loadedLibraries.d.size;
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 < uVar4);
  }
  this_00 = &(this->d).usedStaticInstances;
  iVar5 = QList<QObject_*(*)()>::begin(this_00);
  iVar6 = QList<QObject_*(*)()>::end(this_00);
  for (; iVar5.i != iVar6.i; iVar5.i = iVar5.i + 1) {
    if (*iVar5.i != (_func_QObject_ptr *)0x0) {
      pQVar7 = (**iVar5.i)();
      if (pQVar7 != (QObject *)0x0) {
        (*pQVar7->_vptr_QObject[4])(pQVar7);
      }
    }
  }
  Private::~Private(&this->d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_002d2ad4:
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::~QFactoryLoader()
{
    if (!qt_factoryloader_global.isDestroyed()) {
        QMutexLocker locker(&qt_factoryloader_global->mutex);
        qt_factoryloader_global->loaders.removeOne(this);
    }

#if QT_CONFIG(library)
    for (qsizetype i = 0; i < d->loadedLibraries.size(); ++i) {
        if (d->loadedLibraries.at(i)) {
            auto &plugin = d->libraries.at(i);
            delete plugin->inst.data();
            plugin->unload();
        }
    }
#endif

    for (QtPluginInstanceFunction staticInstance : d->usedStaticInstances) {
        if (staticInstance)
            delete staticInstance();
    }
}